

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O3

void __thiscall
LoopCrosser::LoopCrosser(LoopCrosser *this,S2Loop *a,S2Loop *b,LoopRelation *relation,bool swapped)

{
  vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_> *pvVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  
  this->a_ = a;
  this->b_ = b;
  this->relation_ = relation;
  this->swapped_ = swapped;
  iVar4 = (*relation->_vptr_LoopRelation[2])(relation);
  this->a_crossing_target_ = iVar4;
  iVar4 = (*relation->_vptr_LoopRelation[3])(relation);
  this->b_crossing_target_ = iVar4;
  (this->crosser_).a_cross_b_.c_[0] = 0.0;
  (this->crosser_).a_cross_b_.c_[1] = 0.0;
  (this->crosser_).a_cross_b_.c_[2] = 0.0;
  (this->crosser_).a_tangent_.c_[0] = 0.0;
  (this->crosser_).a_tangent_.c_[1] = 0.0;
  *(undefined1 (*) [16])((this->crosser_).a_tangent_.c_ + 2) = (undefined1  [16])0x0;
  (this->crosser_).b_tangent_.c_[1] = 0.0;
  (this->crosser_).b_tangent_.c_[2] = 0.0;
  pvVar1 = &(this->b_query_).tmp_candidates_;
  (pvVar1->super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar1->super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->b_query_).tmp_candidates_.
  super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->b_query_).index_ = (S2ShapeIndex *)0x0;
  (this->b_query_).a0_.c_[0] = 0.0;
  *(undefined1 (*) [16])((this->b_query_).a0_.c_ + 1) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((this->b_query_).a1_.c_ + 1) = (undefined1  [16])0x0;
  S2CrossingEdgeQuery::Init(&this->b_query_,&(b->index_).super_S2ShapeIndex);
  (this->b_cells_).
  super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->b_cells_).
  super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->b_cells_).
  super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (swapped) {
    uVar2 = this->a_crossing_target_;
    uVar3 = this->b_crossing_target_;
    this->a_crossing_target_ = uVar3;
    this->b_crossing_target_ = uVar2;
  }
  return;
}

Assistant:

LoopCrosser(const S2Loop& a, const S2Loop& b,
              LoopRelation* relation, bool swapped)
      : a_(a), b_(b), relation_(relation), swapped_(swapped),
        a_crossing_target_(relation->a_crossing_target()),
        b_crossing_target_(relation->b_crossing_target()),
        b_query_(&b.index_) {
    using std::swap;
    if (swapped) swap(a_crossing_target_, b_crossing_target_);
  }